

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unoptimized_statement_verifier.cpp
# Opt level: O1

void __thiscall
duckdb::UnoptimizedStatementVerifier::UnoptimizedStatementVerifier
          (UnoptimizedStatementVerifier *this,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement_p,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          parameters)

{
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_50;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Unoptimized","");
  local_50._M_head_impl =
       (statement_p->
       super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>)._M_t.
       super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
       super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl;
  (statement_p->super_unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>).
  _M_t.super___uniq_ptr_impl<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SQLStatement_*,_std::default_delete<duckdb::SQLStatement>_>.
  super__Head_base<0UL,_duckdb::SQLStatement_*,_false>._M_head_impl = (SQLStatement *)0x0;
  StatementVerifier::StatementVerifier
            (&this->super_StatementVerifier,UNOPTIMIZED,&local_48,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             &local_50,parameters);
  if (local_50._M_head_impl != (SQLStatement *)0x0) {
    (*(local_50._M_head_impl)->_vptr_SQLStatement[1])();
  }
  local_50._M_head_impl = (SQLStatement *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_StatementVerifier)._vptr_StatementVerifier =
       (_func_int **)&PTR__StatementVerifier_024afac0;
  return;
}

Assistant:

UnoptimizedStatementVerifier::UnoptimizedStatementVerifier(
    unique_ptr<SQLStatement> statement_p, optional_ptr<case_insensitive_map_t<BoundParameterData>> parameters)
    : StatementVerifier(VerificationType::UNOPTIMIZED, "Unoptimized", std::move(statement_p), parameters) {
}